

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O0

BasicStridedBitArrayView<1U,_const_char> * __thiscall
Corrade::Containers::StridedArrayView<1U,_const_bool>::sliceBit
          (BasicStridedBitArrayView<1U,_const_char> *__return_storage_ptr__,
          StridedArrayView<1U,_const_bool> *this,size_t index)

{
  ostream *poVar1;
  Debug *pDVar2;
  ArithmeticType *data;
  Error local_a8;
  long local_80;
  size_t i;
  StridedDimensions<1U,_long> local_70;
  Stride<1U> stride;
  StridedDimensions<1U,_unsigned_long> local_60;
  Size<1U> sizeOffset;
  Flags local_41;
  Error local_40;
  size_t local_18;
  size_t index_local;
  StridedArrayView<1U,_const_bool> *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (7 < index) {
    poVar1 = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Utility::Error::Error(&local_40,poVar1,local_41);
    pDVar2 = Utility::Debug::operator<<
                       (&local_40.super_Debug,"Containers::StridedArrayView::sliceBit(): index");
    pDVar2 = Utility::Debug::operator<<(pDVar2,local_18);
    pDVar2 = Utility::Debug::operator<<(pDVar2,"out of range for a");
    pDVar2 = Utility::Debug::operator<<(pDVar2,8);
    pDVar2 = Utility::Debug::operator<<(pDVar2,Utility::Debug::nospace);
    Utility::Debug::operator<<(pDVar2,"-bit type");
    Utility::Error::~Error(&local_40);
    abort();
  }
  StridedDimensions<1U,_unsigned_long>::StridedDimensions(&local_60);
  StridedDimensions<1U,_long>::StridedDimensions(&local_70);
  local_80 = 0;
  while( true ) {
    if (local_80 == 1) {
      local_60._data[0] = (unsigned_long  [1])(local_18 & 7 | (ulong)local_60._data[0]);
      BasicStridedBitArrayView<1U,_const_char>::BasicStridedBitArrayView
                (__return_storage_ptr__,&local_60,&local_70,
                 (ErasedType *)((long)this->_data + (local_18 >> 3)));
      return __return_storage_ptr__;
    }
    if (0x1fffffffffffffff < (&this->_size)[local_80]._data[0]) break;
    (&sizeOffset)[local_80 + -1]._data[0] = (&this->_size)[local_80]._data[0] << 3;
    (&stride)[local_80 + -1]._data[0] = (&this->_stride)[local_80]._data[0] << 3;
    local_80 = local_80 + 1;
  }
  poVar1 = Utility::Error::defaultOutput();
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
            ((EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> *)((long)&data + 7));
  Utility::Error::Error(&local_a8,poVar1,data._7_1_);
  pDVar2 = Utility::Debug::operator<<
                     (&local_a8.super_Debug,
                      "Containers::StridedArrayView::sliceBit(): size expected to be smaller than 2^"
                     );
  pDVar2 = Utility::Debug::operator<<(pDVar2,Utility::Debug::nospace);
  pDVar2 = Utility::Debug::operator<<(pDVar2,0x3d);
  pDVar2 = Utility::Debug::operator<<(pDVar2,"bits, got");
  Utility::operator<<<Corrade::Containers::StridedDimensions<1U,_unsigned_long>,_0>
            (pDVar2,&this->_size);
  Utility::Error::~Error(&local_a8);
  abort();
}

Assistant:

auto StridedArrayView<dimensions, T>::sliceBit(const std::size_t index) const -> BasicStridedBitArrayView<dimensions, ArithmeticType> {
    /* Unlike plain slice(begin, end), complex member slicing is usually not
       called in tight loops and should be as checked as possible, so it's not
       a debug assert */
    CORRADE_ASSERT(index < sizeof(T)*8,
        "Containers::StridedArrayView::sliceBit(): index" << index << "out of range for a" << sizeof(T)*8 << Utility::Debug::nospace << "-bit type", {});

    /* Put the size in the upper bits, convert the stride from bytes to bits
       (which, well, is the same operation, HA) */
    Containers::Size<dimensions> sizeOffset{Corrade::NoInit};
    Containers::Stride<dimensions> stride{Corrade::NoInit};
    for(std::size_t i = 0; i != dimensions; ++i) {
        /* All asserts related to BitArray size limits are debug so make this
           one debug as well */
        CORRADE_DEBUG_ASSERT(_size._data[i] < std::size_t{1} << (sizeof(std::size_t)*8 - 3),
            "Containers::StridedArrayView::sliceBit(): size expected to be smaller than 2^" << Utility::Debug::nospace << (sizeof(std::size_t)*8 - 3) << "bits, got" << _size, {});
        sizeOffset._data[i] = _size._data[i] << 3;
        stride._data[i] = _stride._data[i] << 3;
    }

    /* Data pointer is whole bytes */
    ArithmeticType* const data = static_cast<ArithmeticType*>(_data) + (index >> 3);

    /* Offset is the remaining bits in the last byte */
    sizeOffset._data[0] |= index & 0x07;

    /* Using a (friended) private constructor as that's significantly easier
       than going through the public constructors that require a sized
       contiguous view for safety. */
    return BasicStridedBitArrayView<dimensions, ArithmeticType>{sizeOffset, stride, data};
}